

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json_encode_options<char>::~basic_json_encode_options
          (basic_json_encode_options<char> *this,void **vtt)

{
  _func_int **pp_Var1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  pp_Var1 = (_func_int **)*vtt;
  this->_vptr_basic_json_encode_options = pp_Var1;
  *(void **)((long)&this->_vptr_basic_json_encode_options + (long)pp_Var1[-3]) = vtt[1];
  pcVar2 = (this->new_line_chars_)._M_dataplus._M_p;
  paVar3 = &(this->new_line_chars_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~basic_json_encode_options() = default;